

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

JavascriptString * __thiscall
Js::ParseableFunctionInfo::GetCachedSourceString(ParseableFunctionInfo *this)

{
  RecyclerWeakReference<Js::JavascriptString> *this_00;
  JavascriptString *pJVar1;
  JavascriptString *string;
  RecyclerWeakReference<Js::JavascriptString> *weakRef;
  ParseableFunctionInfo *this_local;
  
  this_00 = GetCachedSourceStringWeakRef(this);
  if (this_00 != (RecyclerWeakReference<Js::JavascriptString> *)0x0) {
    pJVar1 = Memory::RecyclerWeakReference<Js::JavascriptString>::Get(this_00);
    if (pJVar1 != (JavascriptString *)0x0) {
      return pJVar1;
    }
    FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)1,decltype(nullptr)>
              (&this->super_FunctionProxy,(void *)0x0);
  }
  return (JavascriptString *)0x0;
}

Assistant:

JavascriptString * ParseableFunctionInfo::GetCachedSourceString()
    {
        RecyclerWeakReference<JavascriptString> * weakRef = GetCachedSourceStringWeakRef();
        if (weakRef)
        {
            JavascriptString * string = weakRef->Get();
            if (string)
            {
                return string;
            }
            this->SetAuxPtr<AuxPointerType::CachedSourceString>(nullptr);
        }
        return nullptr;
    }